

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O2

Mat * __thiscall CircularBuffer<cv::Mat_*>::operator[](CircularBuffer<cv::Mat_*> *this,int index)

{
  uint uVar1;
  
  uVar1 = this->count_of_elements;
  if (index < (int)-uVar1 || ((int)uVar1 <= index || uVar1 == 0)) {
    return (Mat *)0x0;
  }
  if (index < 0) {
    uVar1 = (this->count_of_slots + index + this->last_element_index + 1) % this->count_of_slots;
  }
  else {
    uVar1 = (index + this->first_element_index) % this->count_of_slots;
  }
  return this->data[(int)uVar1];
}

Assistant:

T *CircularBuffer<T *>::operator[](int index) const
{
    if(count_of_elements == 0 || index > ((int) count_of_elements) - 1 || index < -1 * ((int) count_of_elements)) {
        return nullptr;
    }
    int real_index;
    if(index >= 0) {
        real_index = (first_element_index + index) % count_of_slots;
    } else {
        //we add count_of_slots here to be sure that left side of operator % is positive.
        real_index = (((int) last_element_index) + count_of_slots + 1 + index) % count_of_slots;
    }
    return data[real_index];
}